

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

Vec_Ptr_t * Gia_ManTerTranspose(Gia_ManTer_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  if (0 < p->pAig->nRegs) {
    pVVar6 = p->vStates;
    uVar1 = pVVar6->nSize;
    iVar13 = 0;
    uVar8 = 100;
    uVar12 = 0;
    do {
      if ((p->pCount0[uVar12] != pVVar6->nSize) && (p->pCountX[uVar12] < 1)) {
        pvVar5 = calloc((long)(int)((((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0)) * 4 + 8,1)
        ;
        iVar7 = (int)uVar8;
        if (iVar13 == iVar7) {
          if (iVar7 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uint)(iVar7 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,uVar8 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        iVar7 = iVar13 + 1;
        pVVar3->nSize = iVar7;
        ppvVar4[iVar13] = pvVar5;
        pVVar6 = p->vStates;
        iVar13 = iVar7;
        if (0 < pVVar6->nSize) {
          ppvVar4 = pVVar6->pArray;
          bVar9 = 0;
          uVar10 = 0;
          do {
            uVar11 = *(uint *)((long)ppvVar4[uVar10] + (uVar12 >> 4 & 0xfffffff) * 4) >>
                     ((char)uVar12 * '\x02' & 0x1eU);
            if ((uVar11 & 3) == 0) {
              __assert_fail("Value >= GIA_ZER && Value <= GIA_UND",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                            ,0x24,"void Gia_ManTerSimInfoSet(unsigned int *, int, int)");
            }
            uVar14 = uVar10 >> 4 & 0xfffffff;
            uVar2 = *(uint *)((long)pvVar5 + uVar14 * 4);
            *(uint *)((long)pvVar5 + uVar14 * 4) =
                 ((uVar2 >> (bVar9 & 0x1e) ^ uVar11) & 3) << (bVar9 & 0x1e) ^ uVar2;
            uVar10 = uVar10 + 1;
            bVar9 = bVar9 + 2;
          } while ((long)uVar10 < (long)pVVar6->nSize);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)p->pAig->nRegs);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Gia_ManTerTranspose( Gia_ManTer_t * p )
{
    Vec_Ptr_t * vFlops;
    unsigned * pState, * pFlop;
    int i, k, nFlopWords;
    vFlops = Vec_PtrAlloc( 100 );
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) ) 
            continue;
        if ( p->pCountX[i] > 0 )
            continue;
        pFlop = Gia_ManTerStateAlloc( nFlopWords );
        Vec_PtrPush( vFlops, pFlop );
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
            Gia_ManTerSimInfoSet( pFlop, k, Gia_ManTerSimInfoGet(pState, i) );
//Gia_ManTerStatePrint( pFlop, Vec_PtrSize(p->vStates), i );
    }
    return vFlops;
}